

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void glfwSetInputMode(GLFWwindow *handle,int mode,int value)

{
  uint uVar1;
  GLFWbool GVar2;
  int local_28;
  int local_24;
  int i_1;
  int i;
  _GLFWwindow *window;
  int value_local;
  int mode_local;
  GLFWwindow *handle_local;
  
  if (handle != (GLFWwindow *)0x0) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      switch(mode) {
      case 0x33001:
        if ((((value == 0x34001) || (value == 0x34002)) || (value == 0x34003)) || (value == 0x34004)
           ) {
          if (*(int *)(handle + 0x84) != value) {
            *(int *)(handle + 0x84) = value;
            (*_glfw.platform.getCursorPos)
                      ((_GLFWwindow *)handle,(double *)(handle + 0x1f0),(double *)(handle + 0x1f8));
            (*_glfw.platform.setCursorMode)((_GLFWwindow *)handle,value);
          }
        }
        else {
          _glfwInputError(0x10003,"Invalid cursor mode 0x%08X",(ulong)(uint)value);
        }
        break;
      case 0x33002:
        uVar1 = (uint)(value != 0);
        if (*(uint *)(handle + 0x78) != uVar1) {
          if (uVar1 == 0) {
            for (local_24 = 0; local_24 < 0x15d; local_24 = local_24 + 1) {
              if (handle[(long)local_24 + 0x90] == (GLFWwindow)0x3) {
                handle[(long)local_24 + 0x90] = (GLFWwindow)0x0;
              }
            }
          }
          *(uint *)(handle + 0x78) = uVar1;
        }
        break;
      case 0x33003:
        uVar1 = (uint)(value != 0);
        if (*(uint *)(handle + 0x7c) != uVar1) {
          if (uVar1 == 0) {
            for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
              if (handle[(long)local_28 + 0x88] == (GLFWwindow)0x3) {
                handle[(long)local_28 + 0x88] = (GLFWwindow)0x0;
              }
            }
          }
          *(uint *)(handle + 0x7c) = uVar1;
        }
        break;
      case 0x33004:
        *(uint *)(handle + 0x80) = (uint)(value != 0);
        break;
      case 0x33005:
        GVar2 = (*_glfw.platform.rawMouseMotionSupported)();
        if (GVar2 == 0) {
          _glfwInputError(0x10008,"Raw mouse motion is not supported on this system");
        }
        else {
          uVar1 = (uint)(value != 0);
          if (*(uint *)(handle + 0x200) != uVar1) {
            *(uint *)(handle + 0x200) = uVar1;
            (*_glfw.platform.setRawMouseMotion)((_GLFWwindow *)handle,uVar1);
          }
        }
        break;
      default:
        _glfwInputError(0x10003,"Invalid input mode 0x%08X",(ulong)(uint)mode);
      }
    }
    return;
  }
  __assert_fail("window != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/cal-cs184[P]hw0-intro/CGL/deps/glfw/src/input.c"
                ,0x24e,"void glfwSetInputMode(GLFWwindow *, int, int)");
}

Assistant:

GLFWAPI void glfwSetInputMode(GLFWwindow* handle, int mode, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    switch (mode)
    {
        case GLFW_CURSOR:
        {
            if (value != GLFW_CURSOR_NORMAL &&
                value != GLFW_CURSOR_HIDDEN &&
                value != GLFW_CURSOR_DISABLED &&
                value != GLFW_CURSOR_CAPTURED)
            {
                _glfwInputError(GLFW_INVALID_ENUM,
                                "Invalid cursor mode 0x%08X",
                                value);
                return;
            }

            if (window->cursorMode == value)
                return;

            window->cursorMode = value;

            _glfw.platform.getCursorPos(window,
                                        &window->virtualCursorPosX,
                                        &window->virtualCursorPosY);
            _glfw.platform.setCursorMode(window, value);
            return;
        }

        case GLFW_STICKY_KEYS:
        {
            value = value ? GLFW_TRUE : GLFW_FALSE;
            if (window->stickyKeys == value)
                return;

            if (!value)
            {
                int i;

                // Release all sticky keys
                for (i = 0;  i <= GLFW_KEY_LAST;  i++)
                {
                    if (window->keys[i] == _GLFW_STICK)
                        window->keys[i] = GLFW_RELEASE;
                }
            }

            window->stickyKeys = value;
            return;
        }

        case GLFW_STICKY_MOUSE_BUTTONS:
        {
            value = value ? GLFW_TRUE : GLFW_FALSE;
            if (window->stickyMouseButtons == value)
                return;

            if (!value)
            {
                int i;

                // Release all sticky mouse buttons
                for (i = 0;  i <= GLFW_MOUSE_BUTTON_LAST;  i++)
                {
                    if (window->mouseButtons[i] == _GLFW_STICK)
                        window->mouseButtons[i] = GLFW_RELEASE;
                }
            }

            window->stickyMouseButtons = value;
            return;
        }

        case GLFW_LOCK_KEY_MODS:
        {
            window->lockKeyMods = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        }

        case GLFW_RAW_MOUSE_MOTION:
        {
            if (!_glfw.platform.rawMouseMotionSupported())
            {
                _glfwInputError(GLFW_PLATFORM_ERROR,
                                "Raw mouse motion is not supported on this system");
                return;
            }

            value = value ? GLFW_TRUE : GLFW_FALSE;
            if (window->rawMouseMotion == value)
                return;

            window->rawMouseMotion = value;
            _glfw.platform.setRawMouseMotion(window, value);
            return;
        }
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode 0x%08X", mode);
}